

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::Clipper(Clipper *this)

{
  Clipper *this_local;
  
  ClipperBase::ClipperBase((ClipperBase *)&this->field_0x88);
  this->_vptr_Clipper = (_func_int **)&PTR__Clipper_01018f00;
  *(undefined ***)&this->field_0x88 = &PTR__Clipper_01018f50;
  std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::vector
            (&this->m_PolyOuts);
  std::vector<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>::vector(&this->m_Joins)
  ;
  std::vector<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>::vector
            (&this->m_HorizJoins);
  this->m_Scanbeam = (Scanbeam *)0x0;
  this->m_ActiveEdges = (TEdge *)0x0;
  this->m_SortedEdges = (TEdge *)0x0;
  this->m_IntersectNodes = (IntersectNode *)0x0;
  this->m_ExecuteLocked = false;
  (this->_vptr_Clipper[-3] + 0x10)
  [(long)&(this->m_PolyOuts).
          super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>] =
       (code)0x0;
  this->m_ReverseOutput = false;
  return;
}

Assistant:

Clipper::Clipper() : ClipperBase() //constructor
{
  m_Scanbeam = 0;
  m_ActiveEdges = 0;
  m_SortedEdges = 0;
  m_IntersectNodes = 0;
  m_ExecuteLocked = false;
  m_UseFullRange = false;
  m_ReverseOutput = false;
}